

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsCLI11.hpp
# Opt level: O0

void __thiscall helics::helicsCLI11App::add_callback(helicsCLI11App *this,function<void_()> *cback)

{
  bool bVar1;
  function<void_()> *in_RSI;
  App *in_RDI;
  value_type *in_stack_ffffffffffffff98;
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
  *in_stack_ffffffffffffffa0;
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> local_30 [2];
  
  bVar1 = CLI::std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::empty
                    ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)
                     in_RDI);
  if (bVar1) {
    in_stack_ffffffffffffffa0 = local_30;
    std::function<void()>::
    function<helics::helicsCLI11App::add_callback(std::function<void()>)::_lambda()_1_,void>
              ((function<void_()> *)in_RDI,(anon_class_8_1_8991fb9c *)in_RSI);
    CLI::App::callback(in_RDI,in_RSI);
    CLI::std::function<void_()>::~function((function<void_()> *)0x4d6a38);
  }
  CLI::std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::push_back
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  return;
}

Assistant:

void add_callback(std::function<void()> cback)
    {
        if (cbacks.empty()) {
            callback([this]() {
                for (auto& cb : cbacks) {
                    cb();
                }
            });
        }
        cbacks.push_back(std::move(cback));
    }